

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxJumpStatement::Resolve(FxJumpStatement *this,FCompileContext *ctx)

{
  char *pcVar1;
  FxJumpStatement *local_30;
  FxJumpStatement *local_28;
  FCompileContext *local_20;
  FCompileContext *ctx_local;
  FxJumpStatement *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    local_20 = ctx;
    ctx_local = (FCompileContext *)this;
    if (ctx->ControlStmt == (FxExpression *)0x0) {
      pcVar1 = "continue";
      if (this->Token == 0x126) {
        pcVar1 = "break";
      }
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"\'%s\' outside of a loop",pcVar1);
      if (this != (FxJumpStatement *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxJumpStatement *)0x0;
    }
    else if (((FxLoopStatement *)ctx->ControlStmt == ctx->Loop) || (this->Token == 0x129)) {
      local_28 = this;
      TArray<FxJumpStatement_*,_FxJumpStatement_*>::Push(&ctx->Loop->Jumps,&local_28);
    }
    else {
      local_30 = this;
      TArray<FxJumpStatement_*,_FxJumpStatement_*>::Push
                ((TArray<FxJumpStatement_*,_FxJumpStatement_*> *)(ctx->ControlStmt + 2),&local_30);
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxJumpStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();

	if (ctx.ControlStmt != nullptr)
	{
		if (ctx.ControlStmt == ctx.Loop || Token == TK_Continue)
		{
			ctx.Loop->Jumps.Push(this);
		}
		else
		{
			// break in switch.
			static_cast<FxSwitchStatement*>(ctx.ControlStmt)->Breaks.Push(this);
		}
		return this;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "'%s' outside of a loop", Token == TK_Break ? "break" : "continue");
		delete this;
		return nullptr;
	}
}